

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

cmSourceGroup * __thiscall
cmMakefile::GetSourceGroup
          (cmMakefile *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *name)

{
  const_iterator this_00;
  bool bVar1;
  __type _Var2;
  pointer this_01;
  const_reference __rhs;
  size_type sVar3;
  char *pcVar4;
  uint local_6c;
  uint i;
  allocator local_51;
  undefined1 local_50 [8];
  string sgName;
  __normal_iterator<const_cmSourceGroup_*,_std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>_>
  local_28;
  const_iterator sgIt;
  cmSourceGroup *sg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *name_local;
  cmMakefile *this_local;
  
  sgIt._M_current = (cmSourceGroup *)0x0;
  local_28._M_current =
       (cmSourceGroup *)
       std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::begin(&this->SourceGroups);
  while( true ) {
    sgName.field_2._8_8_ =
         std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::end(&this->SourceGroups);
    bVar1 = __gnu_cxx::operator!=
                      (&local_28,
                       (__normal_iterator<const_cmSourceGroup_*,_std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>_>
                        *)((long)&sgName.field_2 + 8));
    if (!bVar1) break;
    this_01 = __gnu_cxx::
              __normal_iterator<const_cmSourceGroup_*,_std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>_>
              ::operator->(&local_28);
    pcVar4 = cmSourceGroup::GetName(this_01);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_50,pcVar4,&local_51);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    __rhs = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](name,0);
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_50,__rhs);
    if (_Var2) {
      sgIt._M_current =
           __gnu_cxx::
           __normal_iterator<const_cmSourceGroup_*,_std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>_>
           ::operator*(&local_28);
    }
    std::__cxx11::string::~string((string *)local_50);
    if (_Var2) break;
    __gnu_cxx::
    __normal_iterator<const_cmSourceGroup_*,_std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>_>
    ::operator++(&local_28);
  }
  if (sgIt._M_current != (cmSourceGroup *)0x0) {
    for (local_6c = 1;
        sVar3 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(name), this_00 = sgIt, local_6c < sVar3; local_6c = local_6c + 1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](name,(ulong)local_6c);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      sgIt._M_current = cmSourceGroup::LookupChild(this_00._M_current,pcVar4);
      if (sgIt._M_current == (cmSourceGroup *)0x0) {
        return (cmSourceGroup *)0x0;
      }
    }
  }
  return sgIt._M_current;
}

Assistant:

cmSourceGroup*
cmMakefile::GetSourceGroup(const std::vector<std::string>&name) const
{
  cmSourceGroup* sg = 0;

  // first look for source group starting with the same as the one we wants
  for (std::vector<cmSourceGroup>::const_iterator
      sgIt = this->SourceGroups.begin();
      sgIt != this->SourceGroups.end(); ++sgIt)
    {
    std::string sgName = sgIt->GetName();
    if(sgName == name[0])
      {
      sg = const_cast<cmSourceGroup*>(&(*sgIt));
      break;
      }
    }

  if(sg != 0)
    {
    // iterate through its children to find match source group
    for(unsigned int i=1; i<name.size(); ++i)
      {
      sg = sg->LookupChild(name[i].c_str());
      if(sg == 0)
        {
        break;
        }
      }
    }
  return sg;
}